

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall mathOps_hypot3_Test::TestBody(mathOps_hypot3_Test *this)

{
  unit_data *puVar1;
  unit_data *puVar2;
  unit_data *puVar3;
  unit_data *__return_storage_ptr__;
  bool bVar4;
  char *pcVar5;
  precise_measurement *val2;
  precise_measurement *in_R8;
  AssertHelper local_150;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_4;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  precise_measurement res3;
  precise_measurement res2;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  precise_measurement res;
  precise_measurement m3;
  precise_measurement m2;
  precise_measurement m1;
  mathOps_hypot3_Test *this_local;
  
  puVar1 = &m2.units_.base_units_;
  units::precise_measurement::precise_measurement
            ((precise_measurement *)puVar1,5.0,(precise_unit *)units::precise::m);
  puVar2 = &m3.units_.base_units_;
  units::precise_measurement::precise_measurement
            ((precise_measurement *)puVar2,5.4,(precise_unit *)units::precise::in);
  puVar3 = &res.units_.base_units_;
  units::precise_measurement::precise_measurement
            ((precise_measurement *)puVar3,0.01,(precise_unit *)units::precise::km);
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            ((precise_measurement *)&gtest_ar.message_,(units *)puVar1,(precise_measurement *)puVar2
             ,(precise_measurement *)puVar3,in_R8);
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)local_80,"res","m1",(precise_measurement *)&gtest_ar.message_,
             (precise_measurement *)puVar1);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar4) {
    testing::Message::Message(local_98);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xb9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)local_b0,"res","m2",(precise_measurement *)&gtest_ar.message_,
             (precise_measurement *)&m3.units_.base_units_);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar4) {
    testing::Message::Message(&local_b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  val2 = (precise_measurement *)&res.units_.base_units_;
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)local_d0,"res","m3",(precise_measurement *)&gtest_ar.message_,val2);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar4) {
    testing::Message::Message(&local_d8);
    val2 = (precise_measurement *)
           testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&res2.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbb,(char *)val2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&res2.units_.base_units_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&res2.units_.base_units_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  __return_storage_ptr__ = &res3.units_.base_units_;
  puVar1 = &res.units_.base_units_;
  puVar2 = &m2.units_.base_units_;
  puVar3 = &m3.units_.base_units_;
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            ((precise_measurement *)__return_storage_ptr__,(units *)puVar1,
             (precise_measurement *)puVar2,(precise_measurement *)puVar3,val2);
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            ((precise_measurement *)&gtest_ar_3.message_,(units *)puVar3,
             (precise_measurement *)puVar1,(precise_measurement *)puVar2,val2);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_120,"res","res2",(precise_measurement *)&gtest_ar.message_,
             (precise_measurement *)__return_storage_ptr__);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar4) {
    testing::Message::Message(&local_128);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbe,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_140,"res2","res3",(precise_measurement *)&res3.units_.base_units_,
             (precise_measurement *)&gtest_ar_3.message_);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar4) {
    testing::Message::Message(&local_148);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  return;
}

Assistant:

TEST(mathOps, hypot3)
{
    precise_measurement m1(5.0, precise::m);
    precise_measurement m2(5.4, precise::in);
    precise_measurement m3(0.01, precise::km);
    auto res = hypot(m1, m2, m3);
    EXPECT_GT(res, m1);
    EXPECT_GT(res, m2);
    EXPECT_GT(res, m3);
    auto res2 = hypot(m3, m1, m2);
    auto res3 = hypot(m2, m3, m1);
    EXPECT_EQ(res, res2);
    EXPECT_EQ(res2, res3);
}